

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

void duckdb::ConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long *plVar1;
  anon_struct_16_2_cfc5f80c_for_inlined *paVar2;
  ValidityMask *pVVar3;
  char cVar4;
  VectorType VVar5;
  VectorType VVar6;
  uint uVar7;
  uint uVar8;
  pointer pVVar9;
  unsigned_long *puVar10;
  anon_union_16_2_67f50693_for_value *paVar11;
  sel_t *psVar12;
  list_entry_t *plVar13;
  SelectionVector *pSVar14;
  data_ptr_t pdVar15;
  pointer pLVar16;
  bool bVar17;
  BoundFunctionExpression *pBVar18;
  pointer pFVar19;
  Vector *pVVar20;
  idx_t iVar21;
  reference pvVar22;
  reference vector;
  long lVar23;
  reference pvVar24;
  undefined8 uVar25;
  uint *puVar26;
  ulong uVar27;
  ulong uVar28;
  idx_t len;
  idx_t i;
  char *pcVar29;
  ulong uVar30;
  ulong uVar31;
  data_ptr_t pdVar32;
  idx_t i_1;
  idx_t row_idx;
  string_t *this;
  ulong uVar33;
  idx_t iVar34;
  anon_class_8_1_6971b95b fun;
  ValidityMask *in_R9;
  ListConcatInputData *data;
  pointer pLVar35;
  idx_t col_idx;
  pointer vector_00;
  data_ptr_t pdVar36;
  ulong uVar37;
  char *pcVar38;
  char *pcVar39;
  idx_t iVar40;
  idx_t i_2;
  ulong uVar41;
  string_t sVar42;
  anon_struct_16_3_d7536bce_for_pointer aVar43;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  idx_t local_150;
  allocator_type local_131;
  ValidityMask *local_130;
  vector<duckdb::ListConcatInputData,_true> input_data;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat local_80;
  list_entry_t *local_38;
  
  pBVar18 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar19 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar18->bind_info);
  cVar4 = *(char *)&pFVar19[4]._vptr_FunctionData;
  if (*(char *)&pFVar19[1]._vptr_FunctionData == 'e') {
    iVar40 = args->count;
    local_130 = (ValidityMask *)result->data;
    input_data.
    super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>.
    super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    input_data.
    super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>.
    super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    input_data.
    super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>.
    super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVVar9 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (vector_00 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start; vector_00 != pVVar9;
        vector_00 = vector_00 + 1) {
      if ((cVar4 != '\0') || ((vector_00->type).id_ != SQLNULL)) {
        pVVar20 = ListVector::GetEntry(vector_00);
        ListConcatInputData::ListConcatInputData((ListConcatInputData *)&ldata,vector_00,pVVar20);
        Vector::ToUnifiedFormat(vector_00,iVar40,&ldata);
        local_38 = (list_entry_t *)ldata.data;
        iVar21 = ListVector::GetListSize(vector_00);
        Vector::ToUnifiedFormat(pVVar20,iVar21,&local_80);
        ::std::vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>::
        emplace_back<duckdb::ListConcatInputData>
                  (&input_data.
                    super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                   ,(ListConcatInputData *)&ldata);
        ListConcatInputData::~ListConcatInputData((ListConcatInputData *)&ldata);
      }
    }
    pVVar20 = result;
    FlatVector::VerifyFlatVector(result);
    iVar34 = 0;
    for (iVar21 = 0;
        pLVar16 = input_data.
                  super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                  .
                  super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pVVar3 = local_130, iVar21 != iVar40;
        iVar21 = iVar21 + 1) {
      lVar23 = iVar21 * 0x10;
      *(idx_t *)((long)local_130 + lVar23) = iVar34;
      pdVar32 = (data_ptr_t)((long)local_130 + lVar23 + 8);
      pdVar32[0] = '\0';
      pdVar32[1] = '\0';
      pdVar32[2] = '\0';
      pdVar32[3] = '\0';
      pdVar32[4] = '\0';
      pdVar32[5] = '\0';
      pdVar32[6] = '\0';
      pdVar32[7] = '\0';
      for (pLVar35 = input_data.
                     super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                     .
                     super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                     ._M_impl.super__Vector_impl_data._M_start; pLVar35 != pLVar16;
          pLVar35 = pLVar35 + 1) {
        psVar12 = ((pLVar35->vdata).sel)->sel_vector;
        row_idx = iVar21;
        if (psVar12 != (sel_t *)0x0) {
          row_idx = (idx_t)psVar12[iVar21];
        }
        bVar17 = TemplatedValidityMask<unsigned_long>::RowIsValid
                           (&(pLVar35->vdata).validity.super_TemplatedValidityMask<unsigned_long>,
                            row_idx);
        if (bVar17) {
          plVar13 = pLVar35->input_entries;
          plVar1 = (long *)((long)pVVar3 + lVar23 + 8);
          *plVar1 = *plVar1 + plVar13[row_idx].length;
          ListVector::Append(pVVar20,pLVar35->child_vec,(pLVar35->child_vdata).sel,
                             plVar13[row_idx].length + plVar13[row_idx].offset,
                             plVar13[row_idx].offset);
        }
        else if (cVar4 != '\0') {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar21);
        }
      }
      iVar34 = iVar34 + *(long *)((long)pVVar3 + lVar23 + 8);
    }
    ListVector::SetListSize(pVVar20,iVar34);
    bVar17 = DataChunk::AllConstant(args);
    if (bVar17) {
      Vector::SetVectorType(pVVar20,CONSTANT_VECTOR);
    }
    ::std::vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>::
    ~vector(&input_data.
             super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
           );
  }
  else {
    if (cVar4 != '\0') {
      fun.result = result;
      pvVar22 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
      vector = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
      VVar5 = pvVar22->vector_type;
      VVar6 = vector->vector_type;
      if ((VVar5 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar6 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        puVar10 = (pvVar22->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        paVar11 = (anon_union_16_2_67f50693_for_value *)result->data;
        if (((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) &&
           ((puVar10 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
            puVar10 == (unsigned_long *)0x0 || ((*puVar10 & 1) != 0)))) {
          aVar43 = (anon_struct_16_3_d7536bce_for_pointer)
                   BinaryLambdaWrapper::
                   Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                             (fun,(string_t)
                                  ((anon_union_16_2_67f50693_for_value *)pvVar22->data)->pointer,
                              (string_t)
                              ((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,in_R9,
                              (idx_t)fun.result);
          paVar11->pointer = aVar43;
          return;
        }
      }
      else {
        local_150 = args->count;
        if ((VVar6 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar5 == FLAT_VECTOR) {
          pdVar32 = pvVar22->data;
          paVar11 = (anon_union_16_2_67f50693_for_value *)vector->data;
          puVar10 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
            Vector::SetVectorType(result,FLAT_VECTOR);
            pdVar36 = result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(pvVar22);
            FlatVector::SetValidity(result,&pvVar22->validity);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              lVar23 = 8;
              while (bVar17 = local_150 != 0, local_150 = local_150 - 1, bVar17) {
                left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + lVar23);
                left_02.value._0_8_ = *(undefined8 *)(pdVar32 + lVar23 + -8);
                sVar42 = BinaryLambdaWrapper::
                         Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   (fun,left_02,(string_t)paVar11->pointer,in_R9,(idx_t)fun.result);
                *(long *)(pdVar36 + lVar23 + -8) = sVar42.value._0_8_;
                *(long *)(pdVar36 + lVar23) = sVar42.value._8_8_;
                lVar23 = lVar23 + 0x10;
              }
              return;
            }
            uVar28 = 0;
            uVar37 = 0;
            do {
              if (uVar28 == local_150 + 0x3f >> 6) {
                return;
              }
              puVar10 = ((fun.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                        validity_mask;
              if (puVar10 == (unsigned_long *)0x0) {
                uVar41 = uVar37 + 0x40;
                if (local_150 <= uVar37 + 0x40) {
                  uVar41 = local_150;
                }
LAB_018425c7:
                uVar30 = uVar37 << 4 | 8;
                for (; uVar27 = uVar37, uVar37 < uVar41; uVar37 = uVar37 + 1) {
                  left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar30);
                  left.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar30 - 8));
                  sVar42 = BinaryLambdaWrapper::
                           Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (fun,left,(string_t)paVar11->pointer,in_R9,(idx_t)fun.result);
                  *(long *)(pdVar36 + (uVar30 - 8)) = sVar42.value._0_8_;
                  *(long *)(pdVar36 + uVar30) = sVar42.value._8_8_;
                  uVar30 = uVar30 + 0x10;
                }
              }
              else {
                uVar30 = puVar10[uVar28];
                uVar41 = uVar37 + 0x40;
                if (local_150 <= uVar37 + 0x40) {
                  uVar41 = local_150;
                }
                if (uVar30 == 0xffffffffffffffff) goto LAB_018425c7;
                uVar27 = uVar41;
                if (uVar30 != 0) {
                  uVar33 = uVar37 << 4 | 8;
                  for (uVar31 = 0; uVar27 = uVar31 + uVar37, uVar31 + uVar37 < uVar41;
                      uVar31 = uVar31 + 1) {
                    if ((uVar30 >> (uVar31 & 0x3f) & 1) != 0) {
                      left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar33);
                      left_00.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar33 - 8));
                      sVar42 = BinaryLambdaWrapper::
                               Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         (fun,left_00,(string_t)paVar11->pointer,in_R9,
                                          (idx_t)fun.result);
                      *(long *)(pdVar36 + (uVar33 - 8)) = sVar42.value._0_8_;
                      *(long *)(pdVar36 + uVar33) = sVar42.value._8_8_;
                    }
                    uVar33 = uVar33 + 0x10;
                  }
                }
              }
              uVar28 = uVar28 + 1;
              uVar37 = uVar27;
            } while( true );
          }
        }
        else {
          if ((VVar5 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar6 != FLAT_VECTOR) {
            if (VVar6 != FLAT_VECTOR || VVar5 != FLAT_VECTOR) {
              UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
              UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&input_data);
              Vector::ToUnifiedFormat(pvVar22,local_150,&ldata);
              Vector::ToUnifiedFormat(vector,local_150,(UnifiedVectorFormat *)&input_data);
              Vector::SetVectorType(result,FLAT_VECTOR);
              pdVar32 = result->data;
              FlatVector::VerifyFlatVector(result);
              if (input_data.
                  super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                  .
                  super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0 &&
                  ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                pdVar32 = pdVar32 + 8;
                for (iVar40 = 0; local_150 != iVar40; iVar40 = iVar40 + 1) {
                  iVar21 = iVar40;
                  if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                    iVar21 = (idx_t)(ldata.sel)->sel_vector[iVar40];
                  }
                  pSVar14 = ((input_data.
                              super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                              .
                              super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                              ._M_impl.super__Vector_impl_data._M_start)->vdata).sel;
                  iVar34 = iVar40;
                  if (pSVar14 != (SelectionVector *)0x0) {
                    iVar34 = (idx_t)*(uint *)((long)&pSVar14->sel_vector + iVar40 * 4);
                  }
                  left_01.value.pointer.ptr =
                       (char *)*(undefined8 *)(ldata.data + iVar21 * 0x10 + 8);
                  left_01.value._0_8_ = *(undefined8 *)(ldata.data + iVar21 * 0x10);
                  right.value.pointer.ptr =
                       (char *)(&((input_data.
                                   super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                                   .
                                   super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->vdata).data)
                               [iVar34 * 2];
                  right.value._0_8_ =
                       (&((input_data.
                           super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                           .
                           super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->vdata).sel)[iVar34 * 2];
                  sVar42 = BinaryLambdaWrapper::
                           Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (fun,left_01,right,in_R9,(idx_t)fun.result);
                  *(long *)(pdVar32 + -8) = sVar42.value._0_8_;
                  *(long *)pdVar32 = sVar42.value._8_8_;
                  pdVar32 = pdVar32 + 0x10;
                }
              }
              else {
                pVVar3 = &(fun.result)->validity;
                pdVar32 = pdVar32 + 8;
                for (iVar40 = 0; local_150 != iVar40; iVar40 = iVar40 + 1) {
                  iVar21 = iVar40;
                  if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                    iVar21 = (idx_t)(ldata.sel)->sel_vector[iVar40];
                  }
                  pSVar14 = ((input_data.
                              super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                              .
                              super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                              ._M_impl.super__Vector_impl_data._M_start)->vdata).sel;
                  iVar34 = iVar40;
                  if (pSVar14 != (SelectionVector *)0x0) {
                    iVar34 = (idx_t)*(uint *)((long)&pSVar14->sel_vector + iVar40 * 4);
                  }
                  if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                        (unsigned_long *)0x0) ||
                      ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar21 >> 6] >> (iVar21 & 0x3f) & 1) != 0)) &&
                     ((input_data.
                       super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                       .
                       super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0 ||
                      (((ulong)(&((input_data.
                                   super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                                   .
                                   super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->vdata).sel)
                               [iVar34 >> 6] >> (iVar34 & 0x3f) & 1) != 0)))) {
                    left_05.value.pointer.ptr =
                         (char *)*(undefined8 *)(ldata.data + iVar21 * 0x10 + 8);
                    left_05.value._0_8_ = *(undefined8 *)(ldata.data + iVar21 * 0x10);
                    right_04.value.pointer.ptr =
                         (char *)(&((input_data.
                                     super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                                     .
                                     super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->vdata).data)
                                 [iVar34 * 2];
                    right_04.value._0_8_ =
                         (&((input_data.
                             super_vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                             .
                             super__Vector_base<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->vdata).sel)[iVar34 * 2];
                    sVar42 = BinaryLambdaWrapper::
                             Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       (fun,left_05,right_04,in_R9,(idx_t)fun.result);
                    *(long *)(pdVar32 + -8) = sVar42.value._0_8_;
                    *(long *)pdVar32 = sVar42.value._8_8_;
                  }
                  else {
                    TemplatedValidityMask<unsigned_long>::SetInvalid
                              (&pVVar3->super_TemplatedValidityMask<unsigned_long>,iVar40);
                  }
                  pdVar32 = pdVar32 + 0x10;
                }
              }
              UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&input_data);
              UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
              return;
            }
            pdVar32 = pvVar22->data;
            pdVar36 = vector->data;
            Vector::SetVectorType(result,FLAT_VECTOR);
            pdVar15 = result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(pvVar22);
            FlatVector::SetValidity(result,&pvVar22->validity);
            FlatVector::VerifyFlatVector(vector);
            local_130 = &result->validity;
            ValidityMask::Combine(&result->validity,&vector->validity,local_150);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              lVar23 = 8;
              while (bVar17 = local_150 != 0, local_150 = local_150 - 1, bVar17) {
                sVar42.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + lVar23);
                sVar42.value._0_8_ = *(undefined8 *)(pdVar32 + lVar23 + -8);
                right_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar36 + lVar23);
                right_06.value._0_8_ = *(undefined8 *)(pdVar36 + lVar23 + -8);
                sVar42 = BinaryLambdaWrapper::
                         Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   (fun,sVar42,right_06,in_R9,(idx_t)fun.result);
                *(long *)(pdVar15 + lVar23 + -8) = sVar42.value._0_8_;
                *(long *)(pdVar15 + lVar23) = sVar42.value._8_8_;
                lVar23 = lVar23 + 0x10;
              }
              return;
            }
            uVar28 = 0;
            uVar37 = 0;
            do {
              if (uVar28 == local_150 + 0x3f >> 6) {
                return;
              }
              puVar10 = (local_130->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar10 == (unsigned_long *)0x0) {
                uVar41 = uVar37 + 0x40;
                if (local_150 <= uVar37 + 0x40) {
                  uVar41 = local_150;
                }
LAB_01842a75:
                uVar30 = uVar37 << 4 | 8;
                for (; uVar27 = uVar37, uVar37 < uVar41; uVar37 = uVar37 + 1) {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar30);
                  left_03.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar30 - 8));
                  right_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar36 + uVar30);
                  right_02.value._0_8_ = *(undefined8 *)(pdVar36 + (uVar30 - 8));
                  sVar42 = BinaryLambdaWrapper::
                           Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (fun,left_03,right_02,in_R9,(idx_t)fun.result);
                  *(long *)(pdVar15 + (uVar30 - 8)) = sVar42.value._0_8_;
                  *(long *)(pdVar15 + uVar30) = sVar42.value._8_8_;
                  uVar30 = uVar30 + 0x10;
                }
              }
              else {
                uVar30 = puVar10[uVar28];
                uVar41 = uVar37 + 0x40;
                if (local_150 <= uVar37 + 0x40) {
                  uVar41 = local_150;
                }
                if (uVar30 == 0xffffffffffffffff) goto LAB_01842a75;
                uVar27 = uVar41;
                if (uVar30 != 0) {
                  uVar33 = uVar37 << 4 | 8;
                  for (uVar31 = 0; uVar27 = uVar31 + uVar37, uVar31 + uVar37 < uVar41;
                      uVar31 = uVar31 + 1) {
                    if ((uVar30 >> (uVar31 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar33);
                      left_04.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar33 - 8));
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar36 + uVar33);
                      right_03.value._0_8_ = *(undefined8 *)(pdVar36 + (uVar33 - 8));
                      sVar42 = BinaryLambdaWrapper::
                               Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         (fun,left_04,right_03,in_R9,(idx_t)fun.result);
                      *(long *)(pdVar15 + (uVar33 - 8)) = sVar42.value._0_8_;
                      *(long *)(pdVar15 + uVar33) = sVar42.value._8_8_;
                    }
                    uVar33 = uVar33 + 0x10;
                  }
                }
              }
              uVar28 = uVar28 + 1;
              uVar37 = uVar27;
            } while( true );
          }
          paVar11 = (anon_union_16_2_67f50693_for_value *)pvVar22->data;
          puVar10 = (pvVar22->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar32 = vector->data;
          if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
            Vector::SetVectorType(result,FLAT_VECTOR);
            pdVar36 = result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(vector);
            FlatVector::SetValidity(result,&vector->validity);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              lVar23 = 8;
              while (bVar17 = local_150 != 0, local_150 = local_150 - 1, bVar17) {
                right_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + lVar23);
                right_05.value._0_8_ = *(undefined8 *)(pdVar32 + lVar23 + -8);
                sVar42 = BinaryLambdaWrapper::
                         Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   (fun,(string_t)paVar11->pointer,right_05,in_R9,(idx_t)fun.result)
                ;
                *(long *)(pdVar36 + lVar23 + -8) = sVar42.value._0_8_;
                *(long *)(pdVar36 + lVar23) = sVar42.value._8_8_;
                lVar23 = lVar23 + 0x10;
              }
              return;
            }
            uVar28 = 0;
            uVar37 = 0;
            do {
              if (uVar28 == local_150 + 0x3f >> 6) {
                return;
              }
              puVar10 = ((fun.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                        validity_mask;
              if (puVar10 == (unsigned_long *)0x0) {
                uVar41 = uVar37 + 0x40;
                if (local_150 <= uVar37 + 0x40) {
                  uVar41 = local_150;
                }
LAB_0184289a:
                uVar30 = uVar37 << 4 | 8;
                for (; uVar27 = uVar37, uVar37 < uVar41; uVar37 = uVar37 + 1) {
                  right_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar30);
                  right_00.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar30 - 8));
                  sVar42 = BinaryLambdaWrapper::
                           Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (fun,(string_t)paVar11->pointer,right_00,in_R9,
                                      (idx_t)fun.result);
                  *(long *)(pdVar36 + (uVar30 - 8)) = sVar42.value._0_8_;
                  *(long *)(pdVar36 + uVar30) = sVar42.value._8_8_;
                  uVar30 = uVar30 + 0x10;
                }
              }
              else {
                uVar30 = puVar10[uVar28];
                uVar41 = uVar37 + 0x40;
                if (local_150 <= uVar37 + 0x40) {
                  uVar41 = local_150;
                }
                if (uVar30 == 0xffffffffffffffff) goto LAB_0184289a;
                uVar27 = uVar41;
                if (uVar30 != 0) {
                  uVar33 = uVar37 << 4 | 8;
                  for (uVar31 = 0; uVar27 = uVar37 + uVar31, uVar37 + uVar31 < uVar41;
                      uVar31 = uVar31 + 1) {
                    if ((uVar30 >> (uVar31 & 0x3f) & 1) != 0) {
                      right_01.value.pointer.ptr = (char *)*(undefined8 *)(pdVar32 + uVar33);
                      right_01.value._0_8_ = *(undefined8 *)(pdVar32 + (uVar33 - 8));
                      sVar42 = BinaryLambdaWrapper::
                               Operation<duckdb::ConcatOperator(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         (fun,(string_t)paVar11->pointer,right_01,in_R9,
                                          (idx_t)fun.result);
                      *(long *)(pdVar36 + (uVar33 - 8)) = sVar42.value._0_8_;
                      *(long *)(pdVar36 + uVar33) = sVar42.value._8_8_;
                    }
                    uVar33 = uVar33 + 0x10;
                  }
                }
              }
              uVar28 = uVar28 + 1;
              uVar37 = uVar27;
            } while( true );
          }
        }
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        fun.result = result;
      }
      ConstantVector::SetNull(fun.result,true);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ldata.sel = (SelectionVector *)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&input_data,args->count,
               (value_type_conflict1 *)&ldata,&local_131);
    lVar23 = 0;
    for (uVar37 = 0;
        uVar37 < (ulong)(((long)(args->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x68);
        uVar37 = uVar37 + 1) {
      pvVar22 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar37);
      if (pvVar22->vector_type == CONSTANT_VECTOR) {
        puVar10 = (pvVar22->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
          lVar23 = lVar23 + (ulong)*(uint *)pvVar22->data;
        }
      }
      else {
        Vector::SetVectorType(result,FLAT_VECTOR);
        UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
        Vector::ToUnifiedFormat(pvVar22,args->count,&ldata);
        pdVar32 = ldata.data;
        for (uVar28 = 0; uVar28 < args->count; uVar28 = uVar28 + 1) {
          uVar41 = uVar28;
          if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
            uVar41 = (ulong)(ldata.sel)->sel_vector[uVar28];
          }
          if ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar41 >> 6]
               >> (uVar41 & 0x3f) & 1) != 0)) {
            uVar7 = *(uint *)(pdVar32 + uVar41 * 0x10);
            pvVar24 = vector<unsigned_long,_true>::get<true>
                                ((vector<unsigned_long,_true> *)&input_data,uVar28);
            *pvVar24 = *pvVar24 + (ulong)uVar7;
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
      }
    }
    this = (string_t *)result->data;
    pcVar38 = (this->value).inlined.inlined + 4;
    for (uVar37 = 0; uVar37 < args->count; uVar37 = uVar37 + 1) {
      pvVar24 = vector<unsigned_long,_true>::get<true>
                          ((vector<unsigned_long,_true> *)&input_data,uVar37);
      sVar42 = StringVector::EmptyString((StringVector *)result,(Vector *)(*pvVar24 + lVar23),len);
      uVar25 = sVar42.value._0_8_;
      paVar2 = (anon_struct_16_2_cfc5f80c_for_inlined *)(pcVar38 + -8);
      paVar2->length = (int)uVar25;
      paVar2->inlined[0] = (char)((ulong)uVar25 >> 0x20);
      paVar2->inlined[1] = (char)((ulong)uVar25 >> 0x28);
      paVar2->inlined[2] = (char)((ulong)uVar25 >> 0x30);
      paVar2->inlined[3] = (char)((ulong)uVar25 >> 0x38);
      *(long *)pcVar38 = sVar42.value._8_8_;
      pvVar24 = vector<unsigned_long,_true>::get<true>
                          ((vector<unsigned_long,_true> *)&input_data,uVar37);
      *pvVar24 = 0;
      pcVar38 = pcVar38 + 0x10;
    }
    pcVar38 = (this->value).pointer.prefix;
    for (uVar37 = 0;
        uVar37 < (ulong)(((long)(args->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x68);
        uVar37 = uVar37 + 1) {
      pvVar22 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar37);
      if (pvVar22->vector_type == CONSTANT_VECTOR) {
        puVar10 = (pvVar22->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
          puVar26 = (uint *)pvVar22->data;
          uVar28 = (ulong)*puVar26;
          if (uVar28 < 0xd) {
            puVar26 = puVar26 + 1;
          }
          else {
            puVar26 = *(uint **)(puVar26 + 2);
          }
          pcVar39 = pcVar38;
          for (uVar41 = 0; uVar41 < args->count; uVar41 = uVar41 + 1) {
            uVar7 = ((anon_struct_16_3_d7536bce_for_pointer *)(pcVar39 + -4))->length;
            pcVar29 = *(char **)(pcVar39 + 4);
            pvVar24 = vector<unsigned_long,_true>::get<true>
                                ((vector<unsigned_long,_true> *)&input_data,uVar41);
            if (uVar7 < 0xd) {
              pcVar29 = pcVar39;
            }
            switchD_01939fa4::default(pcVar29 + *pvVar24,puVar26,uVar28);
            pvVar24 = vector<unsigned_long,_true>::get<true>
                                ((vector<unsigned_long,_true> *)&input_data,uVar41);
            *pvVar24 = *pvVar24 + uVar28;
            pcVar39 = pcVar39 + 0x10;
          }
        }
      }
      else {
        UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
        Vector::ToUnifiedFormat(pvVar22,args->count,&ldata);
        pdVar32 = ldata.data;
        pcVar39 = pcVar38;
        for (uVar28 = 0; uVar28 < args->count; uVar28 = uVar28 + 1) {
          uVar41 = uVar28;
          if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
            uVar41 = (ulong)(ldata.sel)->sel_vector[uVar28];
          }
          if ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar41 >> 6]
               >> (uVar41 & 0x3f) & 1) != 0)) {
            lVar23 = uVar41 * 0x10;
            uVar7 = *(uint *)(pdVar32 + lVar23);
            pdVar36 = *(data_ptr_t *)(pdVar32 + lVar23 + 8);
            uVar8 = ((anon_struct_16_3_d7536bce_for_pointer *)(pcVar39 + -4))->length;
            pcVar29 = *(char **)(pcVar39 + 4);
            pvVar24 = vector<unsigned_long,_true>::get<true>
                                ((vector<unsigned_long,_true> *)&input_data,uVar28);
            if (uVar8 < 0xd) {
              pcVar29 = pcVar39;
            }
            if (uVar7 < 0xd) {
              pdVar36 = pdVar32 + lVar23 + 4;
            }
            switchD_01939fa4::default(pcVar29 + *pvVar24,pdVar36,(ulong)uVar7);
            pvVar24 = vector<unsigned_long,_true>::get<true>
                                ((vector<unsigned_long,_true> *)&input_data,uVar28);
            *pvVar24 = *pvVar24 + (ulong)uVar7;
          }
          pcVar39 = pcVar39 + 0x10;
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
      }
    }
    for (uVar37 = 0; uVar37 < args->count; uVar37 = uVar37 + 1) {
      string_t::Finalize(this);
      this = this + 1;
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&input_data);
  }
  return;
}

Assistant:

static void ConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ConcatFunctionData>();
	if (info.return_type.id() == LogicalTypeId::LIST) {
		return ListConcatFunction(args, state, result, info.is_operator);
	} else if (info.is_operator) {
		return ConcatOperator(args, state, result);
	}
	return StringConcatFunction(args, state, result);
}